

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make-unique.h
# Opt level: O0

unique_ptr<wabt::ReturnCallIndirectExpr,_std::default_delete<wabt::ReturnCallIndirectExpr>_>
wabt::MakeUnique<wabt::ReturnCallIndirectExpr>(void)

{
  ReturnCallIndirectExpr *this;
  __uniq_ptr_data<wabt::ReturnCallIndirectExpr,_std::default_delete<wabt::ReturnCallIndirectExpr>,_true,_true>
  in_RDI;
  Location local_30;
  
  this = (ReturnCallIndirectExpr *)operator_new(0xc0);
  Location::Location(&local_30);
  ReturnCallIndirectExpr::ReturnCallIndirectExpr(this,&local_30);
  std::unique_ptr<wabt::ReturnCallIndirectExpr,std::default_delete<wabt::ReturnCallIndirectExpr>>::
  unique_ptr<std::default_delete<wabt::ReturnCallIndirectExpr>,void>
            ((unique_ptr<wabt::ReturnCallIndirectExpr,std::default_delete<wabt::ReturnCallIndirectExpr>>
              *)in_RDI.
                super___uniq_ptr_impl<wabt::ReturnCallIndirectExpr,_std::default_delete<wabt::ReturnCallIndirectExpr>_>
                ._M_t.
                super__Tuple_impl<0UL,_wabt::ReturnCallIndirectExpr_*,_std::default_delete<wabt::ReturnCallIndirectExpr>_>
                .super__Head_base<0UL,_wabt::ReturnCallIndirectExpr_*,_false>._M_head_impl,this);
  return (__uniq_ptr_data<wabt::ReturnCallIndirectExpr,_std::default_delete<wabt::ReturnCallIndirectExpr>,_true,_true>
          )(tuple<wabt::ReturnCallIndirectExpr_*,_std::default_delete<wabt::ReturnCallIndirectExpr>_>
            )in_RDI.
             super___uniq_ptr_impl<wabt::ReturnCallIndirectExpr,_std::default_delete<wabt::ReturnCallIndirectExpr>_>
             ._M_t.
             super__Tuple_impl<0UL,_wabt::ReturnCallIndirectExpr_*,_std::default_delete<wabt::ReturnCallIndirectExpr>_>
             .super__Head_base<0UL,_wabt::ReturnCallIndirectExpr_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}